

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O0

void __thiscall
FShaderProgram::Compile
          (FShaderProgram *this,ShaderType type,char *name,FString *code,char *defines,
          int maxGlslVersion)

{
  FString *pFVar1;
  GLuint GVar2;
  size_t sVar3;
  char *pcVar4;
  FShaderProgram local_80;
  GLint local_74;
  char *pcStack_70;
  GLint status;
  char *sources [1];
  undefined1 local_60 [4];
  int lengths [1];
  FString patchedCode;
  FString local_48;
  GLuint *local_40;
  GLuint *handle;
  char *pcStack_30;
  int maxGlslVersion_local;
  char *defines_local;
  FString *code_local;
  char *name_local;
  FShaderProgram *pFStack_10;
  ShaderType type_local;
  FShaderProgram *this_local;
  
  handle._4_4_ = maxGlslVersion;
  pcStack_30 = defines;
  defines_local = (char *)code;
  code_local = (FString *)name;
  name_local._4_4_ = type;
  pFStack_10 = this;
  CreateShader(this,type);
  local_40 = this->mShaders + name_local._4_4_;
  GVar2 = *local_40;
  FString::FString(&local_48,(char *)code_local);
  FGLDebug::LabelObject(0x82e1,GVar2,&local_48);
  FString::~FString(&local_48);
  PatchShader((FShaderProgram *)local_60,name_local._4_4_,(FString *)defines_local,pcStack_30,
              handle._4_4_);
  sVar3 = FString::Len((FString *)local_60);
  sources[0]._4_4_ = (undefined4)sVar3;
  pcStack_70 = FString::GetChars((FString *)local_60);
  (*_ptrc_glShaderSource)(*local_40,1,&stack0xffffffffffffff90,(GLint *)((long)sources + 4));
  (*_ptrc_glCompileShader)(*local_40);
  local_74 = 0;
  (*_ptrc_glGetShaderiv)(*local_40,0x8b81,&local_74);
  pFVar1 = code_local;
  if (local_74 == 0) {
    GetShaderInfoLog(&local_80,(GLuint)this);
    pcVar4 = FString::GetChars((FString *)&local_80);
    I_FatalError("Compile Shader \'%s\':\n%s\n",pFVar1,pcVar4);
    FString::~FString((FString *)&local_80);
  }
  else {
    if (this->mProgram == 0) {
      GVar2 = (*_ptrc_glCreateProgram)();
      this->mProgram = GVar2;
    }
    (*_ptrc_glAttachShader)(this->mProgram,*local_40);
  }
  FString::~FString((FString *)local_60);
  return;
}

Assistant:

void FShaderProgram::Compile(ShaderType type, const char *name, const FString &code, const char *defines, int maxGlslVersion)
{
	CreateShader(type);

	const auto &handle = mShaders[type];

	FGLDebug::LabelObject(GL_SHADER, handle, name);

	FString patchedCode = PatchShader(type, code, defines, maxGlslVersion);
	int lengths[1] = { (int)patchedCode.Len() };
	const char *sources[1] = { patchedCode.GetChars() };
	glShaderSource(handle, 1, sources, lengths);

	glCompileShader(handle);

	GLint status = 0;
	glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
	if (status == GL_FALSE)
	{
		I_FatalError("Compile Shader '%s':\n%s\n", name, GetShaderInfoLog(handle).GetChars());
	}
	else
	{
		if (mProgram == 0)
			mProgram = glCreateProgram();
		glAttachShader(mProgram, handle);
	}
}